

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlcachedresult.cpp
# Opt level: O2

void __thiscall QSqlCachedResult::detachFromResultSet(QSqlCachedResult *this)

{
  EVP_PKEY_CTX *in_RSI;
  
  cleanup(this,in_RSI);
  return;
}

Assistant:

void QSqlCachedResult::detachFromResultSet()
{
    cleanup();
}